

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

void __thiscall
phmap::priv::
parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>
::swap<phmap::NullMutex>
          (parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>
           *this,parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>
                 *that)

{
  undefined8 uVar1;
  long lVar2;
  
  lVar2 = 0x28;
  do {
    uVar1 = *(undefined8 *)((long)(this->sets_)._M_elems + lVar2 + -0x28);
    *(undefined8 *)((long)(this->sets_)._M_elems + lVar2 + -0x28) =
         *(undefined8 *)((long)(that->sets_)._M_elems + lVar2 + -0x28);
    *(undefined8 *)((long)(that->sets_)._M_elems + lVar2 + -0x28) = uVar1;
    uVar1 = *(undefined8 *)((long)(this->sets_)._M_elems + lVar2 + -0x20);
    *(undefined8 *)((long)(this->sets_)._M_elems + lVar2 + -0x20) =
         *(undefined8 *)((long)(that->sets_)._M_elems + lVar2 + -0x20);
    *(undefined8 *)((long)(that->sets_)._M_elems + lVar2 + -0x20) = uVar1;
    uVar1 = *(undefined8 *)((long)(this->sets_)._M_elems + lVar2 + -0x18);
    *(undefined8 *)((long)(this->sets_)._M_elems + lVar2 + -0x18) =
         *(undefined8 *)((long)(that->sets_)._M_elems + lVar2 + -0x18);
    *(undefined8 *)((long)(that->sets_)._M_elems + lVar2 + -0x18) = uVar1;
    uVar1 = *(undefined8 *)((long)(this->sets_)._M_elems + lVar2 + -0x10);
    *(undefined8 *)((long)(this->sets_)._M_elems + lVar2 + -0x10) =
         *(undefined8 *)((long)(that->sets_)._M_elems + lVar2 + -0x10);
    *(undefined8 *)((long)(that->sets_)._M_elems + lVar2 + -0x10) = uVar1;
    uVar1 = *(undefined8 *)((long)&(this->sets_)._M_elems[0].set_.ctrl_ + lVar2);
    *(undefined8 *)((long)&(this->sets_)._M_elems[0].set_.ctrl_ + lVar2) =
         *(undefined8 *)((long)&(that->sets_)._M_elems[0].set_.ctrl_ + lVar2);
    *(undefined8 *)((long)&(that->sets_)._M_elems[0].set_.ctrl_ + lVar2) = uVar1;
    lVar2 = lVar2 + 0x30;
  } while (lVar2 != 0x328);
  return;
}

Assistant:

void swap(parallel_hash_set<N, RefSet, Mtx2_, Policy, Hash, Eq, Alloc>& that)
        noexcept(IsNoThrowSwappable<EmbeddedSet>() &&
                 (!AllocTraits::propagate_on_container_swap::value ||
                  IsNoThrowSwappable<allocator_type>(typename AllocTraits::propagate_on_container_swap{})))
    {
        using std::swap;
        using Lockable2 = phmap::LockableImpl<Mtx2_>;
         
        for (size_t i=0; i<num_tables; ++i)
        {
            typename Lockable::UniqueLock l(sets_[i]);
            typename Lockable2::UniqueLock l2(that.get_inner(i));
            swap(sets_[i].set_, that.get_inner(i).set_);
        }
    }